

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

void __thiscall
cfd::js::api::json::ParseDescriptorResponse::ParseDescriptorResponse(ParseDescriptorResponse *this)

{
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  ParseDescriptorResponse *local_10;
  ParseDescriptorResponse *this_local;
  
  local_10 = this;
  core::JsonClassBase<cfd::js::api::json::ParseDescriptorResponse>::JsonClassBase
            (&this->super_JsonClassBase<cfd::js::api::json::ParseDescriptorResponse>);
  (this->super_JsonClassBase<cfd::js::api::json::ParseDescriptorResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__ParseDescriptorResponse_01b3c3e0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->ignore_items);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->type_,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->address_,"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->locking_script_,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->hash_type_,"",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->redeem_script_,"",&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_28);
  this->include_multisig_ = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->tree_string_,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  core::
  JsonObjectVector<cfd::js::api::json::DescriptorKeyJson,_cfd::js::api::DescriptorKeyJsonStruct>::
  JsonObjectVector(&this->keys_);
  core::
  JsonObjectVector<cfd::js::api::json::DescriptorScriptJson,_cfd::js::api::DescriptorScriptJsonStruct>
  ::JsonObjectVector(&this->scripts_);
  CollectFieldName();
  return;
}

Assistant:

ParseDescriptorResponse() {
    CollectFieldName();
  }